

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

int __thiscall QAccessibleMenu::childCount(QAccessibleMenu *this)

{
  qsizetype qVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QList<QAction_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  menu((QAccessibleMenu *)0x7da9f5);
  QWidget::actions(in_RDI);
  qVar1 = QList<QAction_*>::size(&local_20);
  QList<QAction_*>::~QList((QList<QAction_*> *)0x7daa1c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)qVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMenu::childCount() const
{
    return menu()->actions().size();
}